

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

int __thiscall
SVGChart::PlotDataContainer::GetPlotIndexByName(PlotDataContainer *this,string *inName)

{
  bool bVar1;
  __type_conflict _Var2;
  size_type sVar3;
  const_reference ppLVar4;
  LegendData *theLegendData;
  int theI;
  string *inName_local;
  PlotDataContainer *this_local;
  
  bVar1 = CheckState(this);
  if (bVar1) {
    for (theLegendData._4_4_ = 0;
        sVar3 = std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::size
                          (&this->mLegendDataList), theLegendData._4_4_ < (int)sVar3;
        theLegendData._4_4_ = theLegendData._4_4_ + 1) {
      ppLVar4 = std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::
                operator[](&this->mLegendDataList,(long)theLegendData._4_4_);
      _Var2 = std::operator==(&(*ppLVar4)->mName,inName);
      if (_Var2) {
        return theLegendData._4_4_;
      }
    }
  }
  return -1;
}

Assistant:

int PlotDataContainer::GetPlotIndexByName (const string &inName) const {

      if (CheckState ()) {
        for (int theI = 0; theI < int(mLegendDataList.size());theI++) {
          LegendData *theLegendData = mLegendDataList[theI];
          if (theLegendData->mName == inName) {
            return theI;
          }
        }
      }
      return -1;
    }